

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresbund.cpp
# Opt level: O2

UChar * ures_getStringByKeyWithFallback_63
                  (UResourceBundle *resB,char *inKey,int32_t *len,UErrorCode *status)

{
  UChar *pUVar1;
  int local_f4;
  UResourceBundle stack;
  
  memset(&stack,0,200);
  ures_getByKeyWithFallback_63(resB,inKey,&stack,status);
  pUVar1 = ures_getString_63(&stack,&local_f4,status);
  ures_close_63(&stack);
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    if (local_f4 == 3) {
      local_f4 = 3;
      if (((*pUVar1 == L'∅') && (pUVar1[1] == L'∅')) && (pUVar1[2] == L'∅')) {
        *status = U_MISSING_RESOURCE_ERROR;
        local_f4 = 0;
        pUVar1 = (UChar *)0x0;
      }
    }
    if (len != (int32_t *)0x0) {
      *len = local_f4;
    }
  }
  else {
    pUVar1 = (UChar *)0x0;
  }
  return pUVar1;
}

Assistant:

U_INTERNAL const UChar* U_EXPORT2 
ures_getStringByKeyWithFallback(const UResourceBundle *resB, 
                                const char* inKey, 
                                int32_t* len,
                                UErrorCode *status) {

    UResourceBundle stack;
    const UChar* retVal = NULL;
    ures_initStackObject(&stack);
    ures_getByKeyWithFallback(resB, inKey, &stack, status);
    int32_t length;
    retVal = ures_getString(&stack, &length, status);
    ures_close(&stack);
    if (U_FAILURE(*status)) {
        return NULL;
    }
    if (length == 3 && retVal[0] == EMPTY_SET && retVal[1] == EMPTY_SET && retVal[2] == EMPTY_SET ) {
        retVal = NULL;
        length = 0;
        *status = U_MISSING_RESOURCE_ERROR;
    }
    if (len != NULL) {
        *len = length;
    }
    return retVal;
}